

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

leaf_node<int,_false> *
immutable::rrb_details::transient_leaf_node_clone<int,false,6>
          (leaf_node<int,_false> *original,guid_type guid)

{
  uint uVar1;
  leaf_node<int,_false> *plVar2;
  uint32_t i;
  ulong uVar3;
  
  plVar2 = (leaf_node<int,_false> *)calloc(1,0x118);
  uVar1 = original->len;
  plVar2->len = uVar1;
  plVar2->child = (int *)(plVar2 + 1);
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    (&plVar2[1].type)[uVar3] = original->child[uVar3];
  }
  plVar2->guid = guid;
  return plVar2;
}

Assistant:

inline leaf_node<T, atomic_ref_counting>* transient_leaf_node_clone(const leaf_node<T, atomic_ref_counting>* original, guid_type guid)
      {
      leaf_node<T, atomic_ref_counting>* clone = (leaf_node<T, atomic_ref_counting>*)malloc(sizeof(leaf_node<T, atomic_ref_counting>) + (bits<N>::rrb_branching) * sizeof(T));
      memset(clone, 0, sizeof(leaf_node<T, atomic_ref_counting>) + (bits<N>::rrb_branching) * sizeof(T));
      clone->len = original->len;
      clone->type = LEAF_NODE;
      clone->child = (T*)((char*)clone + sizeof(leaf_node<T, atomic_ref_counting>));
      //memcpy(clone->child, original->child, original->len * sizeof(T));
      for (uint32_t i = 0; i < original->len; ++i)
        clone->child[i] = original->child[i]; // don't memcpy, but use copy constructor
      clone->guid = guid;
      return clone;
      }